

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional-main.t.hpp
# Opt level: O0

ostream * lest::operator<<(ostream *os,optional<long> *v)

{
  ostream *poVar1;
  long *value;
  bool local_42;
  allocator<char> local_41;
  string local_40;
  optional *local_20;
  optional<long> *v_local;
  ostream *os_local;
  
  local_20 = (optional *)v;
  v_local = (optional<long> *)os;
  poVar1 = std::operator<<(os,"[optional:");
  local_42 = std::optional::operator_cast_to_bool(local_20);
  if (local_42) {
    value = std::optional<long>::operator*((optional<long> *)local_20);
    to_string<long>(&local_40,value);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"[empty]",&local_41);
  }
  local_42 = !local_42;
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  os_local = std::operator<<(poVar1,"]");
  std::__cxx11::string::~string((string *)&local_40);
  if (local_42) {
    std::allocator<char>::~allocator(&local_41);
  }
  return os_local;
}

Assistant:

inline std::ostream & operator<<( std::ostream & os, nonstd::optional<T> const & v )
{
    using lest::to_string;
    return os << "[optional:" << (v ? to_string(*v) : "[empty]") << "]";
}